

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O0

void test_ecc_montgomery_multiply(void)

{
  MontgomeryCurve *mc;
  mp_int *x;
  MontgomeryPoint *pMVar1;
  MontgomeryPoint *r;
  MontgomeryPoint *A;
  size_t i;
  mp_int *exponent;
  MontgomeryPoint *a;
  MontgomeryCurve *wc;
  
  mc = mcurve();
  exponent = (mp_int *)0x0;
  x = mp_new(0x38);
  for (A = (MontgomeryPoint *)0x0; pMVar1 = (MontgomeryPoint *)(*looplimit)(7), A < pMVar1;
      A = (MontgomeryPoint *)((long)&A->X + 1)) {
    pMVar1 = mpoint(mc,(size_t)A);
    if (exponent != (mp_int *)0x0) {
      ecc_montgomery_point_copy_into((MontgomeryPoint *)exponent,pMVar1);
      ecc_montgomery_point_free(pMVar1);
      pMVar1 = (MontgomeryPoint *)exponent;
    }
    exponent = (mp_int *)pMVar1;
    mp_random_fill(x);
    log_start();
    pMVar1 = ecc_montgomery_multiply((MontgomeryPoint *)exponent,x);
    log_end();
    ecc_montgomery_point_free(pMVar1);
  }
  ecc_montgomery_point_free((MontgomeryPoint *)exponent);
  ecc_montgomery_curve_free(mc);
  mp_free(x);
  return;
}

Assistant:

static void test_ecc_montgomery_multiply(void)
{
    MontgomeryCurve *wc = mcurve();
    MontgomeryPoint *a = NULL;
    mp_int *exponent = mp_new(56);
    for (size_t i = 0; i < looplimit(7); i++) {
        MontgomeryPoint *A = mpoint(wc, i);
        if (!a) {
            a = A;
        } else {
            ecc_montgomery_point_copy_into(a, A);
            ecc_montgomery_point_free(A);
        }
        mp_random_fill(exponent);

        log_start();
        MontgomeryPoint *r = ecc_montgomery_multiply(a, exponent);
        log_end();

        ecc_montgomery_point_free(r);
    }
    ecc_montgomery_point_free(a);
    ecc_montgomery_curve_free(wc);
    mp_free(exponent);
}